

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O2

int __thiscall
QTextMarkdownImporter::cbText(QTextMarkdownImporter *this,int textType,char *text,uint size)

{
  QString *t;
  QTextImageFormat *this_00;
  qsizetype qVar1;
  qreal qVar2;
  Data *pDVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  char16_t *tmp;
  iterator iVar8;
  undefined1 *puVar9;
  QDebug *pQVar10;
  QTextList *pQVar11;
  QChar QVar12;
  char16_t *pcVar13;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QUrl local_b8;
  QDebug local_b0;
  QArrayDataPointer<char16_t> local_a8;
  QTextFormat local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_needsInsertBlock == true) {
    insertBlock(this);
  }
  if ((cbText(int,char_const*,unsigned_int)::openingBracket == '\0') &&
     (iVar7 = __cxa_guard_acquire(&cbText(int,char_const*,unsigned_int)::openingBracket), iVar7 != 0
     )) {
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_68._8_4_ = 0x60ea56;
    local_68._12_4_ = 0;
    local_a8.size = 0;
    local_68._16_4_ = 9;
    local_68._20_4_ = 0;
    QRegularExpression::QRegularExpression
              (&cbText::openingBracket,(QArrayDataPointer<char16_t> *)local_68,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    __cxa_atexit(QRegularExpression::~QRegularExpression,&cbText::openingBracket,&__dso_handle);
    __cxa_guard_release(&cbText(int,char_const*,unsigned_int)::openingBracket);
  }
  if ((cbText(int,char_const*,unsigned_int)::closingBracket == '\0') &&
     (iVar7 = __cxa_guard_acquire(&cbText(int,char_const*,unsigned_int)::closingBracket), iVar7 != 0
     )) {
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_68._8_4_ = 0x60ea6a;
    local_68._12_4_ = 0;
    local_a8.size = 0;
    local_68._16_4_ = 7;
    local_68._20_4_ = 0;
    QRegularExpression::QRegularExpression
              (&cbText::closingBracket,(QArrayDataPointer<char16_t> *)local_68,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    __cxa_atexit(QRegularExpression::~QRegularExpression,&cbText::closingBracket,&__dso_handle);
    __cxa_guard_release(&cbText(int,char_const*,unsigned_int)::closingBracket);
  }
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::fromUtf8((QString *)&local_a8,text,(long)(int)size);
  switch(textType) {
  case 0:
    if (this->m_htmlTagDepth == 0) goto switchD_0052cb17_caseD_5;
    QString::append((QString *)&this->m_htmlAccumulator);
    local_68._0_4_ = SUB84(local_a8.d,0);
    local_68._4_4_ = (undefined4)((ulong)local_a8.d >> 0x20);
    local_68._8_4_ = SUB84(local_a8.ptr,0);
    local_68._12_4_ = (undefined4)((ulong)local_a8.ptr >> 0x20);
    puVar9 = (undefined1 *)local_a8.size;
    goto LAB_0052cd6b;
  case 1:
    QVar12.ucs = L'�';
    break;
  case 2:
    QVar12.ucs = L'\n';
    break;
  case 3:
    QVar12.ucs = L' ';
    break;
  case 4:
    if (this->m_htmlTagDepth == 0) {
      QTextCursor::insertHtml(&this->m_cursor,(QString *)&local_a8);
    }
    else {
      QString::append((QString *)&this->m_htmlAccumulator);
    }
    goto LAB_0052cd42;
  default:
    goto switchD_0052cb17_caseD_5;
  case 6:
    uVar6 = 0;
    while (iVar7 = QString::indexOf((QRegularExpression *)&local_a8,0x7b70d8,
                                    (QRegularExpressionMatch *)(ulong)uVar6), -1 < iVar7) {
      this->m_htmlTagDepth = this->m_htmlTagDepth + 1;
      uVar6 = iVar7 + 2;
    }
    uVar6 = 0;
    while (iVar7 = QString::indexOf((QRegularExpression *)&local_a8,0x7b70e8,
                                    (QRegularExpressionMatch *)(ulong)uVar6), -1 < iVar7) {
      this->m_htmlTagDepth = this->m_htmlTagDepth + -1;
      uVar6 = iVar7 + 2;
    }
    t = &this->m_htmlAccumulator;
    QString::append((QString *)t);
    if (this->m_htmlTagDepth == 0) {
      lcMD();
      if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_68._0_4_ = 2;
        local_68._4_4_ = 0;
        local_68._8_4_ = 0;
        local_68._12_4_ = 0;
        local_68._16_4_ = 0;
        local_68._20_4_ = 0;
        pcStack_50 = (char16_t *)lcMD::category.name;
        QMessageLogger::debug();
        pQVar10 = QDebug::operator<<((QDebug *)&local_d8,"HTML");
        QDebug::operator<<(pQVar10,t);
        QDebug::~QDebug((QDebug *)&local_d8);
      }
      QTextCursor::insertHtml(&this->m_cursor,t);
      if ((this->m_spanFormatStack).super_QList<QTextCharFormat>.d.size == 0) {
        QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_68);
        QTextCursor::setCharFormat(&this->m_cursor,(QTextCharFormat *)local_68);
        QTextFormat::~QTextFormat((QTextFormat *)local_68);
      }
      else {
        iVar8 = QList<QTextCharFormat>::end(&(this->m_spanFormatStack).super_QList<QTextCharFormat>)
        ;
        QTextCursor::setCharFormat(&this->m_cursor,iVar8.i + -1);
      }
      pDVar3 = (this->m_htmlAccumulator).d.d;
      pcVar13 = (this->m_htmlAccumulator).d.ptr;
      (this->m_htmlAccumulator).d.d = (Data *)0x0;
      (this->m_htmlAccumulator).d.ptr = (char16_t *)0x0;
      local_68._0_4_ = SUB84(pDVar3,0);
      local_68._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_68._8_4_ = SUB84(pcVar13,0);
      local_68._12_4_ = (undefined4)((ulong)pcVar13 >> 0x20);
      qVar1 = (this->m_htmlAccumulator).d.size;
      (this->m_htmlAccumulator).d.size = 0;
      local_68._16_4_ = (undefined4)qVar1;
      local_68._20_4_ = (undefined4)((ulong)qVar1 >> 0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
    }
LAB_0052cd42:
    local_68._0_4_ = SUB84(local_a8.d,0);
    local_68._4_4_ = (undefined4)((ulong)local_a8.d >> 0x20);
    local_68._8_4_ = SUB84(local_a8.ptr,0);
    local_68._12_4_ = (undefined4)((ulong)local_a8.ptr >> 0x20);
    puVar9 = (undefined1 *)local_a8.size;
LAB_0052cd6b:
    local_a8.size = 0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.d = (Data *)0x0;
    local_68._16_4_ = SUB84(puVar9,0);
    local_68._20_4_ = (undefined4)((ulong)puVar9 >> 0x20);
    goto LAB_0052cd6f;
  }
  QString::QString((QString *)local_68,QVar12);
  pDVar3 = (Data *)CONCAT44(local_68._4_4_,local_68._0_4_);
  pcVar13 = (char16_t *)CONCAT44(local_68._12_4_,local_68._8_4_);
  local_68._0_4_ = SUB84(local_a8.d,0);
  local_68._4_4_ = (undefined4)((ulong)local_a8.d >> 0x20);
  local_68._8_4_ = SUB84(local_a8.ptr,0);
  local_68._12_4_ = (undefined4)((ulong)local_a8.ptr >> 0x20);
  puVar9 = (undefined1 *)CONCAT44(local_68._20_4_,local_68._16_4_);
  local_68._16_4_ = (undefined4)local_a8.size;
  local_68._20_4_ = (undefined4)((ulong)local_a8.size >> 0x20);
  local_a8.d = pDVar3;
  local_a8.ptr = pcVar13;
  local_a8.size = (qsizetype)puVar9;
LAB_0052cd6f:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
switchD_0052cb17_caseD_5:
  pcVar13 = local_a8.ptr;
  pDVar3 = local_a8.d;
  if (this->m_blockType == 7) {
    if (((undefined1 *)local_a8.size == (undefined1 *)0x1) && (*local_a8.ptr == L'\n')) {
      this->m_needsInsertBlock = true;
      local_a8.d = (Data *)0x0;
      local_68._0_4_ = SUB84(pDVar3,0);
      local_68._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      local_68._8_4_ = SUB84(pcVar13,0);
      local_68._12_4_ = (undefined4)((ulong)pcVar13 >> 0x20);
      local_68._16_4_ = 1;
      local_68._20_4_ = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
    }
  }
  else if (this->m_blockType == 0xf) {
    QList<int>::append(&this->m_nonEmptyTableCells,this->m_tableCol);
  }
  if (this->m_imageSpan == true) {
    this_00 = &this->m_imageFormat;
    ::QVariant::QVariant((QVariant *)local_68,(QString *)&local_a8);
    QTextFormat::setProperty((QTextFormat *)this_00,0x5002,(QVariant *)local_68);
    ::QVariant::~QVariant((QVariant *)local_68);
    lcMD();
    if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_68._0_4_ = 2;
      local_68._4_4_ = 0;
      local_68._8_4_ = 0;
      local_68._12_4_ = 0;
      local_68._16_4_ = 0;
      local_68._20_4_ = 0;
      pcStack_50 = (char16_t *)lcMD::category.name;
      QMessageLogger::debug();
      pQVar10 = QDebug::operator<<((QDebug *)&local_118,"image");
      QTextImageFormat::name((QString *)&local_d8,this_00);
      pQVar10 = QDebug::operator<<(pQVar10,(QString *)&local_d8);
      pQVar10 = QDebug::operator<<(pQVar10,"title");
      QTextFormat::stringProperty((QString *)&local_f8,(QTextFormat *)this_00,0x5001);
      pQVar10 = QDebug::operator<<(pQVar10,(QString *)&local_f8);
      pQVar10 = QDebug::operator<<(pQVar10,"alt");
      pQVar10 = QDebug::operator<<(pQVar10,(QString *)&local_a8);
      pQVar10 = QDebug::operator<<(pQVar10,"relative to");
      local_b8.d = (QUrlPrivate *)pQVar10->stream;
      ((Stream *)local_b8.d)->ref = ((Stream *)local_b8.d)->ref + 1;
      QTextCursor::document(&this->m_cursor);
      QTextDocument::baseUrl((QTextDocument *)local_78);
      ::operator<<((QDebug *)&local_b0,&local_b8);
      QDebug::~QDebug(&local_b0);
      QUrl::~QUrl((QUrl *)local_78);
      QDebug::~QDebug((QDebug *)&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QDebug::~QDebug((QDebug *)&local_118);
    }
    QTextCursor::insertImage(&this->m_cursor,this_00);
  }
  else {
    if ((undefined1 *)local_a8.size != (undefined1 *)0x0) {
      QTextCursor::insertText(&this->m_cursor,(QString *)&local_a8);
    }
    pQVar11 = QTextCursor::currentList(&this->m_cursor);
    if (pQVar11 != (QTextList *)0x0) {
      local_68._0_4_ = 0xaaaaaaaa;
      local_68._4_4_ = 0xaaaaaaaa;
      local_68._8_4_ = -0x55555556;
      local_68._12_4_ = 0xaaaaaaaa;
      QTextCursor::blockFormat((QTextCursor *)local_68);
      QTextBlockFormat::setIndent((QTextBlockFormat *)local_68,0);
      QTextCursor::setBlockFormat(&this->m_cursor,(QTextBlockFormat *)local_68);
      QTextFormat::~QTextFormat((QTextFormat *)local_68);
    }
    lcMD();
    cVar4 = QLoggingCategory::isEnabled(0x7b70f8);
    if (cVar4 != '\0') {
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::blockFormat((QTextCursor *)local_78);
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (char16_t *)0x0;
      local_d8.size = 0;
      pQVar11 = QTextCursor::currentList(&this->m_cursor);
      if (pQVar11 != (QTextList *)0x0) {
        QTextCursor::currentList(&this->m_cursor);
        QTextList::format((QTextList *)&local_88);
        iVar7 = QTextListFormat::indent((QTextListFormat *)&local_88);
        QString::number((int)&local_118,iVar7);
        local_48 = local_118.size;
        pcStack_50 = local_118.ptr;
        pDVar3 = local_118.d;
        local_68._0_4_ = 0x11;
        local_68._4_4_ = 0;
        local_68._8_4_ = 0x60e9b1;
        local_68._12_4_ = 0;
        local_118.d = (Data *)0x0;
        local_118.ptr = (char16_t *)0x0;
        local_68._16_4_ = SUB84(pDVar3,0);
        local_68._20_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
        local_118.size = 0;
        QStringBuilder<QLatin1String,_QString>::convertTo<QString>
                  ((QString *)&local_f8,(QStringBuilder<QLatin1String,_QString> *)local_68);
        local_d8.ptr = local_f8.ptr;
        local_d8.d = local_f8.d;
        local_f8.d = (Data *)0x0;
        local_f8.ptr = (char16_t *)0x0;
        local_d8.size = local_f8.size;
        local_f8.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)(local_68 + 0x10));
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
        QTextFormat::~QTextFormat(&local_88);
      }
      bVar5 = QTextFormat::hasProperty((QTextFormat *)local_78,0x1080);
      if (bVar5) {
        iVar7 = QTextFormat::intProperty((QTextFormat *)local_78,0x1080);
        QString::number((int)&local_f8,iVar7);
        local_48 = local_f8.size;
        pcStack_50 = local_f8.ptr;
        pDVar3 = local_f8.d;
        local_68._0_4_ = 0x17;
        local_68._4_4_ = 0;
        local_68._8_4_ = 0x60e9c3;
        local_68._12_4_ = 0;
        local_f8.d = (Data *)0x0;
        local_f8.ptr = (char16_t *)0x0;
        local_68._16_4_ = SUB84(pDVar3,0);
        local_68._20_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
        local_f8.size = 0;
        ::operator+=((QString *)&local_d8,(QStringBuilder<QLatin1String,_QString> *)local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)(local_68 + 0x10));
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      }
      bVar5 = QTextFormat::hasProperty((QTextFormat *)local_78,0x1090);
      if (bVar5) {
        QString::append((QLatin1String *)&local_d8);
      }
      lcMD();
      if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_68._0_4_ = 2;
        local_68._4_4_ = 0;
        local_68._8_4_ = 0;
        local_68._12_4_ = 0;
        local_68._16_4_ = 0;
        local_68._20_4_ = 0;
        pcStack_50 = (char16_t *)lcMD::category.name;
        QMessageLogger::debug();
        pQVar10 = QDebug::operator<<((QDebug *)&local_118,textType);
        pQVar10 = QDebug::operator<<(pQVar10,"in block");
        pQVar10 = QDebug::operator<<(pQVar10,this->m_blockType);
        pQVar10 = QDebug::operator<<(pQVar10,(QString *)&local_a8);
        QString::toLocal8Bit((QByteArray *)&local_f8,(QString *)&local_d8);
        pcVar13 = local_f8.ptr;
        if (local_f8.ptr == (char16_t *)0x0) {
          pcVar13 = (char16_t *)&QByteArray::_empty;
        }
        pQVar10 = QDebug::operator<<(pQVar10,(char *)pcVar13);
        pQVar10 = QDebug::operator<<(pQVar10,"bindent");
        iVar7 = QTextBlockFormat::indent((QTextBlockFormat *)local_78);
        pQVar10 = QDebug::operator<<(pQVar10,iVar7);
        pQVar10 = QDebug::operator<<(pQVar10,"tindent");
        qVar2 = QTextBlockFormat::textIndent((QTextBlockFormat *)local_78);
        pQVar10 = QDebug::operator<<(pQVar10,qVar2);
        pQVar10 = QDebug::operator<<(pQVar10,"margins");
        qVar2 = QTextBlockFormat::leftMargin((QTextBlockFormat *)local_78);
        pQVar10 = QDebug::operator<<(pQVar10,qVar2);
        qVar2 = QTextBlockFormat::topMargin((QTextBlockFormat *)local_78);
        pQVar10 = QDebug::operator<<(pQVar10,qVar2);
        qVar2 = QTextBlockFormat::bottomMargin((QTextBlockFormat *)local_78);
        pQVar10 = QDebug::operator<<(pQVar10,qVar2);
        qVar2 = QTextBlockFormat::rightMargin((QTextBlockFormat *)local_78);
        QDebug::operator<<(pQVar10,qVar2);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
        QDebug::~QDebug((QDebug *)&local_118);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QTextFormat::~QTextFormat((QTextFormat *)local_78);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int QTextMarkdownImporter::cbText(int textType, const char *text, unsigned size)
{
    if (m_needsInsertBlock)
        insertBlock();
#if QT_CONFIG(regularexpression)
    static const QRegularExpression openingBracket(QStringLiteral("<[a-zA-Z]"));
    static const QRegularExpression closingBracket(QStringLiteral("(/>|</)"));
#endif
    QString s = QString::fromUtf8(text, int(size));

    switch (textType) {
    case MD_TEXT_NORMAL:
#if QT_CONFIG(regularexpression)
        if (m_htmlTagDepth) {
            m_htmlAccumulator += s;
            s = QString();
        }
#endif
        break;
    case MD_TEXT_NULLCHAR:
        s = QString(QChar(u'\xFFFD')); // CommonMark-required replacement for null
        break;
    case MD_TEXT_BR:
        s = QString(qtmi_Newline);
        break;
    case MD_TEXT_SOFTBR:
        s = QString(qtmi_Space);
        break;
    case MD_TEXT_CODE:
        // We'll see MD_SPAN_CODE too, which will set the char format, and that's enough.
        break;
#if QT_CONFIG(texthtmlparser)
    case MD_TEXT_ENTITY:
        if (m_htmlTagDepth)
            m_htmlAccumulator += s;
        else
            m_cursor.insertHtml(s);
        s = QString();
        break;
#endif
    case MD_TEXT_HTML:
        // count how many tags are opened and how many are closed
#if QT_CONFIG(regularexpression) && QT_CONFIG(texthtmlparser)
        {
            int startIdx = 0;
            while ((startIdx = s.indexOf(openingBracket, startIdx)) >= 0) {
                ++m_htmlTagDepth;
                startIdx += 2;
            }
            startIdx = 0;
            while ((startIdx = s.indexOf(closingBracket, startIdx)) >= 0) {
                --m_htmlTagDepth;
                startIdx += 2;
            }
        }
        m_htmlAccumulator += s;
        if (!m_htmlTagDepth) { // all open tags are now closed
            qCDebug(lcMD) << "HTML" << m_htmlAccumulator;
            m_cursor.insertHtml(m_htmlAccumulator);
            if (m_spanFormatStack.isEmpty())
                m_cursor.setCharFormat(QTextCharFormat());
            else
                m_cursor.setCharFormat(m_spanFormatStack.top());
            m_htmlAccumulator = QString();
        }
#endif
        s = QString();
        break;
    }

    switch (m_blockType) {
    case MD_BLOCK_TD:
        m_nonEmptyTableCells.append(m_tableCol);
        break;
    case MD_BLOCK_CODE:
        if (s == qtmi_Newline) {
            // defer a blank line until we see something else in the code block,
            // to avoid ending every code block with a gratuitous blank line
            m_needsInsertBlock = true;
            s = QString();
        }
        break;
    default:
        break;
    }

    if (m_imageSpan) {
        // TODO we don't yet support alt text with formatting, because of the cases where m_cursor
        // already inserted the text above.  Rather need to accumulate it in case we need it here.
        m_imageFormat.setProperty(QTextFormat::ImageAltText, s);
        qCDebug(lcMD) << "image" << m_imageFormat.name()
                      << "title" << m_imageFormat.stringProperty(QTextFormat::ImageTitle)
                      << "alt" << s << "relative to" << m_cursor.document()->baseUrl();
        m_cursor.insertImage(m_imageFormat);
        return 0; // no error
    }

    if (!s.isEmpty())
        m_cursor.insertText(s);
    if (m_cursor.currentList()) {
        // The list item will indent the list item's text, so we don't need indentation on the block.
        QTextBlockFormat bfmt = m_cursor.blockFormat();
        bfmt.setIndent(0);
        m_cursor.setBlockFormat(bfmt);
    }
    if (lcMD().isEnabled(QtDebugMsg)) {
        QTextBlockFormat bfmt = m_cursor.blockFormat();
        QString debugInfo;
        if (m_cursor.currentList())
            debugInfo = "in list at depth "_L1 + QString::number(m_cursor.currentList()->format().indent());
        if (bfmt.hasProperty(QTextFormat::BlockQuoteLevel))
            debugInfo += "in blockquote at depth "_L1 +
                    QString::number(bfmt.intProperty(QTextFormat::BlockQuoteLevel));
        if (bfmt.hasProperty(QTextFormat::BlockCodeLanguage))
            debugInfo += "in a code block"_L1;
        qCDebug(lcMD) << textType << "in block" << m_blockType << s << qPrintable(debugInfo)
                      << "bindent" << bfmt.indent() << "tindent" << bfmt.textIndent()
                      << "margins" << bfmt.leftMargin() << bfmt.topMargin() << bfmt.bottomMargin() << bfmt.rightMargin();
    }
    return 0; // no error
}